

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::TracingServiceImpl::ConsumerEndpointImpl::ObserveEvents
          (ConsumerEndpointImpl *this,uint32_t events_mask)

{
  ulong uVar1;
  _Base_ptr p_Var2;
  _Rb_tree_node_base *p_Var3;
  _Rb_tree_header *p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  bool bVar7;
  
  this->observable_events_mask_ = events_mask;
  uVar1 = this->tracing_session_id_;
  if (uVar1 != 0) {
    p_Var5 = (this->service_->tracing_sessions_)._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_parent;
    if (p_Var5 != (_Base_ptr)0x0) {
      p_Var4 = &(this->service_->tracing_sessions_)._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = &p_Var4->_M_header;
      do {
        if (*(ulong *)(p_Var5 + 1) >= uVar1) {
          p_Var6 = p_Var5;
        }
        p_Var5 = (&p_Var5->_M_left)[*(ulong *)(p_Var5 + 1) < uVar1];
      } while (p_Var5 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var6 != p_Var4) && (*(ulong *)(p_Var6 + 1) <= uVar1)) {
        if ((events_mask & 1) != 0) {
          p_Var3 = (_Rb_tree_node_base *)p_Var6[0xf]._M_left;
          if (p_Var3 != (_Rb_tree_node_base *)(p_Var6 + 0xf)) {
            do {
              p_Var5 = (this->service_->producers_)._M_t._M_impl.super__Rb_tree_header._M_header.
                       _M_parent;
              p_Var2 = &(this->service_->producers_)._M_t._M_impl.super__Rb_tree_header._M_header;
              do {
                bVar7 = (ushort)(short)p_Var5[1]._M_color < (ushort)(short)p_Var3[1]._M_color;
                if (!bVar7) {
                  p_Var2 = p_Var5;
                }
                p_Var5 = (&p_Var5->_M_left)[bVar7];
              } while (p_Var5 != (_Base_ptr)0x0);
              OnDataSourceInstanceStateChange
                        (this,(ProducerEndpointImpl *)p_Var2[1]._M_parent,
                         (DataSourceInstance *)&p_Var3[1]._M_parent);
              p_Var3 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var3);
            } while (p_Var3 != (_Rb_tree_node_base *)(p_Var6 + 0xf));
            events_mask = this->observable_events_mask_;
          }
        }
        if ((events_mask & 2) != 0) {
          MaybeNotifyAllDataSourcesStarted(this->service_,(TracingSession *)&p_Var6[1]._M_parent);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void TracingServiceImpl::ConsumerEndpointImpl::ObserveEvents(
    uint32_t events_mask) {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  observable_events_mask_ = events_mask;
  TracingSession* session = service_->GetTracingSession(tracing_session_id_);
  if (!session)
    return;

  if (observable_events_mask_ & ObservableEvents::TYPE_DATA_SOURCES_INSTANCES) {
    // Issue initial states.
    for (const auto& kv : session->data_source_instances) {
      ProducerEndpointImpl* producer = service_->GetProducer(kv.first);
      PERFETTO_DCHECK(producer);
      OnDataSourceInstanceStateChange(*producer, kv.second);
    }
  }

  // If the ObserveEvents() call happens after data sources have acked already
  // notify immediately.
  if (observable_events_mask_ &
      ObservableEvents::TYPE_ALL_DATA_SOURCES_STARTED) {
    service_->MaybeNotifyAllDataSourcesStarted(session);
  }
}